

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void __thiscall tcu::x11::glx::GlxRenderContext::~GlxRenderContext(GlxRenderContext *this)

{
  GlxDrawable *pGVar1;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_00769970;
  clearCurrent(this);
  if (this->m_GLXContext != (GLXContext)0x0) {
    glXDestroyContext((this->m_glxDisplay).super_XlibDisplay.m_display);
  }
  pGVar1 = (this->m_glxDrawable).
           super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
           .m_data.ptr;
  if (pGVar1 != (GlxDrawable *)0x0) {
    (*pGVar1->_vptr_GlxDrawable[1])();
    (this->m_glxDrawable).
    super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>.
    m_data.ptr = (GlxDrawable *)0x0;
  }
  (this->m_glxDisplay).super_XlibDisplay.super_DisplayBase._vptr_DisplayBase =
       (_func_int **)&PTR__GlxDisplay_00769a10;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->m_glxDisplay).m_extensions._M_t);
  XlibDisplay::~XlibDisplay(&(this->m_glxDisplay).super_XlibDisplay);
  return;
}

Assistant:

GlxRenderContext::~GlxRenderContext (void)
{
	clearCurrent();
	if (m_GLXContext != DE_NULL)
		glXDestroyContext(m_glxDisplay.getXDisplay(), m_GLXContext);
}